

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O0

void leveldb::_Test_GetLevel0Ordering::_RunIt(void)

{
  undefined1 local_a8 [8];
  _Test_GetLevel0Ordering t;
  
  _Test_GetLevel0Ordering((_Test_GetLevel0Ordering *)local_a8);
  _Run((_Test_GetLevel0Ordering *)local_a8);
  ~_Test_GetLevel0Ordering((_Test_GetLevel0Ordering *)local_a8);
  return;
}

Assistant:

TEST(DBTest, GetLevel0Ordering) {
  do {
    // Check that we process level-0 files in correct order.  The code
    // below generates two level-0 files where the earlier one comes
    // before the later one in the level-0 file list since the earlier
    // one has a smaller "smallest" key.
    ASSERT_OK(Put("bar", "b"));
    ASSERT_OK(Put("foo", "v1"));
    dbfull()->TEST_CompactMemTable();
    ASSERT_OK(Put("foo", "v2"));
    dbfull()->TEST_CompactMemTable();
    ASSERT_EQ("v2", Get("foo"));
  } while (ChangeOptions());
}